

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg.cpp
# Opt level: O3

class_t * __thiscall
cfgfile::generator::cfg::tag_class_t::cfg(class_t *__return_storage_ptr__,tag_class_t *this)

{
  tag_base_class_t *this_00;
  pointer pcVar1;
  size_t __n;
  pointer pcVar2;
  pos_t pVar3;
  bool bVar4;
  int iVar5;
  pointer psVar6;
  ulong uVar7;
  long lVar8;
  undefined1 local_c8 [152];
  
  class_t::class_t(__return_storage_ptr__);
  std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  this_00 = &this->m_base_class_name;
  bVar4 = tag_t<cfgfile::string_trait_t>::is_defined((tag_t<cfgfile::string_trait_t> *)this_00);
  if (!bVar4) goto LAB_0010b360;
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->m_base_name);
  tag_base_class_t::tag_name_abi_cxx11_((string *)local_c8,this_00);
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->m_tag_name);
  pcVar1 = local_c8 + 0x10;
  if ((pointer)local_c8._0_8_ != pcVar1) {
    operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
  }
  __n = (__return_storage_ptr__->m_base_name)._M_string_length;
  if (__n == DAT_0013f3e0) {
    if (__n == 0) goto LAB_0010b360;
    iVar5 = bcmp((__return_storage_ptr__->m_base_name)._M_dataplus._M_p,
                 c_no_value_tag_name_abi_cxx11_,__n);
    if (iVar5 == 0) goto LAB_0010b360;
  }
  pcVar2 = (this->m_base_class_name).m_value_type.m_value._M_dataplus._M_p;
  local_c8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_c8,pcVar2,
             pcVar2 + (this->m_base_class_name).m_value_type.m_value._M_string_length);
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->m_base_value_type);
  if ((pointer)local_c8._0_8_ != pcVar1) {
    operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
  }
  tag_base_class_t::cfg((field_t *)local_c8,this_00);
  std::vector<cfgfile::generator::cfg::field_t,_std::allocator<cfgfile::generator::cfg::field_t>_>::
  push_back(&__return_storage_ptr__->m_fields,(value_type *)local_c8);
  field_t::~field_t((field_t *)local_c8);
LAB_0010b360:
  pVar3 = (this->
          super_tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
          ).super_tag_t<cfgfile::string_trait_t>.m_column_number;
  __return_storage_ptr__->m_line_number =
       (this->
       super_tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
       ).super_tag_t<cfgfile::string_trait_t>.m_line_number;
  __return_storage_ptr__->m_column_number = pVar3;
  bVar4 = tag_t<cfgfile::string_trait_t>::is_defined
                    (&(this->m_scalar_tags).super_tag_t<cfgfile::string_trait_t>);
  if ((bVar4) &&
     (psVar6 = (this->m_scalar_tags).m_tags.
               super__Vector_base<std::shared_ptr<cfgfile::generator::cfg::tag_field_t>,_std::allocator<std::shared_ptr<cfgfile::generator::cfg::tag_field_t>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
     (this->m_scalar_tags).m_tags.
     super__Vector_base<std::shared_ptr<cfgfile::generator::cfg::tag_field_t>,_std::allocator<std::shared_ptr<cfgfile::generator::cfg::tag_field_t>_>_>
     ._M_impl.super__Vector_impl_data._M_finish != psVar6)) {
    lVar8 = 0;
    uVar7 = 0;
    do {
      tag_field_t::cfg((field_t *)local_c8,
                       *(tag_field_t **)
                        ((long)&(psVar6->
                                super___shared_ptr<cfgfile::generator::cfg::tag_field_t,_(__gnu_cxx::_Lock_policy)2>
                                )._M_ptr + lVar8));
      std::
      vector<cfgfile::generator::cfg::field_t,_std::allocator<cfgfile::generator::cfg::field_t>_>::
      push_back(&__return_storage_ptr__->m_fields,(value_type *)local_c8);
      field_t::~field_t((field_t *)local_c8);
      uVar7 = uVar7 + 1;
      psVar6 = (this->m_scalar_tags).m_tags.
               super__Vector_base<std::shared_ptr<cfgfile::generator::cfg::tag_field_t>,_std::allocator<std::shared_ptr<cfgfile::generator::cfg::tag_field_t>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar8 = lVar8 + 0x10;
    } while (uVar7 < (ulong)((long)(this->m_scalar_tags).m_tags.
                                   super__Vector_base<std::shared_ptr<cfgfile::generator::cfg::tag_field_t>,_std::allocator<std::shared_ptr<cfgfile::generator::cfg::tag_field_t>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)psVar6 >> 4));
  }
  bVar4 = tag_t<cfgfile::string_trait_t>::is_defined
                    (&(this->m_no_value_tags).super_tag_t<cfgfile::string_trait_t>);
  if ((bVar4) &&
     (psVar6 = (this->m_no_value_tags).m_tags.
               super__Vector_base<std::shared_ptr<cfgfile::generator::cfg::tag_field_t>,_std::allocator<std::shared_ptr<cfgfile::generator::cfg::tag_field_t>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
     (this->m_no_value_tags).m_tags.
     super__Vector_base<std::shared_ptr<cfgfile::generator::cfg::tag_field_t>,_std::allocator<std::shared_ptr<cfgfile::generator::cfg::tag_field_t>_>_>
     ._M_impl.super__Vector_impl_data._M_finish != psVar6)) {
    lVar8 = 0;
    uVar7 = 0;
    do {
      tag_field_t::cfg((field_t *)local_c8,
                       *(tag_field_t **)
                        ((long)&(psVar6->
                                super___shared_ptr<cfgfile::generator::cfg::tag_field_t,_(__gnu_cxx::_Lock_policy)2>
                                )._M_ptr + lVar8));
      std::
      vector<cfgfile::generator::cfg::field_t,_std::allocator<cfgfile::generator::cfg::field_t>_>::
      push_back(&__return_storage_ptr__->m_fields,(value_type *)local_c8);
      field_t::~field_t((field_t *)local_c8);
      uVar7 = uVar7 + 1;
      psVar6 = (this->m_no_value_tags).m_tags.
               super__Vector_base<std::shared_ptr<cfgfile::generator::cfg::tag_field_t>,_std::allocator<std::shared_ptr<cfgfile::generator::cfg::tag_field_t>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar8 = lVar8 + 0x10;
    } while (uVar7 < (ulong)((long)(this->m_no_value_tags).m_tags.
                                   super__Vector_base<std::shared_ptr<cfgfile::generator::cfg::tag_field_t>,_std::allocator<std::shared_ptr<cfgfile::generator::cfg::tag_field_t>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)psVar6 >> 4));
  }
  bVar4 = tag_t<cfgfile::string_trait_t>::is_defined
                    (&(this->m_scalar_vector_tags).super_tag_t<cfgfile::string_trait_t>);
  if ((bVar4) &&
     (psVar6 = (this->m_scalar_vector_tags).m_tags.
               super__Vector_base<std::shared_ptr<cfgfile::generator::cfg::tag_field_t>,_std::allocator<std::shared_ptr<cfgfile::generator::cfg::tag_field_t>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
     (this->m_scalar_vector_tags).m_tags.
     super__Vector_base<std::shared_ptr<cfgfile::generator::cfg::tag_field_t>,_std::allocator<std::shared_ptr<cfgfile::generator::cfg::tag_field_t>_>_>
     ._M_impl.super__Vector_impl_data._M_finish != psVar6)) {
    lVar8 = 0;
    uVar7 = 0;
    do {
      tag_field_t::cfg((field_t *)local_c8,
                       *(tag_field_t **)
                        ((long)&(psVar6->
                                super___shared_ptr<cfgfile::generator::cfg::tag_field_t,_(__gnu_cxx::_Lock_policy)2>
                                )._M_ptr + lVar8));
      std::
      vector<cfgfile::generator::cfg::field_t,_std::allocator<cfgfile::generator::cfg::field_t>_>::
      push_back(&__return_storage_ptr__->m_fields,(value_type *)local_c8);
      field_t::~field_t((field_t *)local_c8);
      uVar7 = uVar7 + 1;
      psVar6 = (this->m_scalar_vector_tags).m_tags.
               super__Vector_base<std::shared_ptr<cfgfile::generator::cfg::tag_field_t>,_std::allocator<std::shared_ptr<cfgfile::generator::cfg::tag_field_t>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar8 = lVar8 + 0x10;
    } while (uVar7 < (ulong)((long)(this->m_scalar_vector_tags).m_tags.
                                   super__Vector_base<std::shared_ptr<cfgfile::generator::cfg::tag_field_t>,_std::allocator<std::shared_ptr<cfgfile::generator::cfg::tag_field_t>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)psVar6 >> 4));
  }
  bVar4 = tag_t<cfgfile::string_trait_t>::is_defined
                    (&(this->m_vector_of_tags_tags).super_tag_t<cfgfile::string_trait_t>);
  if ((bVar4) &&
     (psVar6 = (this->m_vector_of_tags_tags).m_tags.
               super__Vector_base<std::shared_ptr<cfgfile::generator::cfg::tag_field_t>,_std::allocator<std::shared_ptr<cfgfile::generator::cfg::tag_field_t>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
     (this->m_vector_of_tags_tags).m_tags.
     super__Vector_base<std::shared_ptr<cfgfile::generator::cfg::tag_field_t>,_std::allocator<std::shared_ptr<cfgfile::generator::cfg::tag_field_t>_>_>
     ._M_impl.super__Vector_impl_data._M_finish != psVar6)) {
    lVar8 = 0;
    uVar7 = 0;
    do {
      tag_field_t::cfg((field_t *)local_c8,
                       *(tag_field_t **)
                        ((long)&(psVar6->
                                super___shared_ptr<cfgfile::generator::cfg::tag_field_t,_(__gnu_cxx::_Lock_policy)2>
                                )._M_ptr + lVar8));
      std::
      vector<cfgfile::generator::cfg::field_t,_std::allocator<cfgfile::generator::cfg::field_t>_>::
      push_back(&__return_storage_ptr__->m_fields,(value_type *)local_c8);
      field_t::~field_t((field_t *)local_c8);
      uVar7 = uVar7 + 1;
      psVar6 = (this->m_vector_of_tags_tags).m_tags.
               super__Vector_base<std::shared_ptr<cfgfile::generator::cfg::tag_field_t>,_std::allocator<std::shared_ptr<cfgfile::generator::cfg::tag_field_t>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar8 = lVar8 + 0x10;
    } while (uVar7 < (ulong)((long)(this->m_vector_of_tags_tags).m_tags.
                                   super__Vector_base<std::shared_ptr<cfgfile::generator::cfg::tag_field_t>,_std::allocator<std::shared_ptr<cfgfile::generator::cfg::tag_field_t>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)psVar6 >> 4));
  }
  bVar4 = tag_t<cfgfile::string_trait_t>::is_defined
                    (&(this->m_custom_tags).super_tag_t<cfgfile::string_trait_t>);
  if ((bVar4) &&
     (psVar6 = (this->m_custom_tags).m_tags.
               super__Vector_base<std::shared_ptr<cfgfile::generator::cfg::tag_field_t>,_std::allocator<std::shared_ptr<cfgfile::generator::cfg::tag_field_t>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
     (this->m_custom_tags).m_tags.
     super__Vector_base<std::shared_ptr<cfgfile::generator::cfg::tag_field_t>,_std::allocator<std::shared_ptr<cfgfile::generator::cfg::tag_field_t>_>_>
     ._M_impl.super__Vector_impl_data._M_finish != psVar6)) {
    lVar8 = 0;
    uVar7 = 0;
    do {
      tag_field_t::cfg((field_t *)local_c8,
                       *(tag_field_t **)
                        ((long)&(psVar6->
                                super___shared_ptr<cfgfile::generator::cfg::tag_field_t,_(__gnu_cxx::_Lock_policy)2>
                                )._M_ptr + lVar8));
      std::
      vector<cfgfile::generator::cfg::field_t,_std::allocator<cfgfile::generator::cfg::field_t>_>::
      push_back(&__return_storage_ptr__->m_fields,(value_type *)local_c8);
      field_t::~field_t((field_t *)local_c8);
      uVar7 = uVar7 + 1;
      psVar6 = (this->m_custom_tags).m_tags.
               super__Vector_base<std::shared_ptr<cfgfile::generator::cfg::tag_field_t>,_std::allocator<std::shared_ptr<cfgfile::generator::cfg::tag_field_t>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar8 = lVar8 + 0x10;
    } while (uVar7 < (ulong)((long)(this->m_custom_tags).m_tags.
                                   super__Vector_base<std::shared_ptr<cfgfile::generator::cfg::tag_field_t>,_std::allocator<std::shared_ptr<cfgfile::generator::cfg::tag_field_t>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)psVar6 >> 4));
  }
  return __return_storage_ptr__;
}

Assistant:

class_t
tag_class_t::cfg() const
{
	class_t c;
	c.set_name( value() );

	if( m_base_class_name.is_defined() )
	{
		c.set_base_name( m_base_class_name.value() );

		c.set_tag_name( m_base_class_name.tag_name() );

		if( c.base_name() != c_no_value_tag_name )
		{
			c.set_base_value_type( m_base_class_name.value_type() );

			c.add_field( m_base_class_name.cfg() );
		}
	}

	c.set_line_number( line_number() );
	c.set_column_number( column_number() );

	if( m_scalar_tags.is_defined() )
	{
		for( std::size_t i = 0; i < m_scalar_tags.size(); ++i )
			c.add_field( m_scalar_tags.at( i ).cfg() );
	}

	if( m_no_value_tags.is_defined() )
	{
		for( std::size_t i = 0; i < m_no_value_tags.size(); ++i )
			c.add_field( m_no_value_tags.at( i ).cfg() );
	}

	if( m_scalar_vector_tags.is_defined() )
	{
		for( std::size_t i = 0; i < m_scalar_vector_tags.size(); ++i )
			c.add_field( m_scalar_vector_tags.at( i ).cfg() );
	}

	if( m_vector_of_tags_tags.is_defined() )
	{
		for( std::size_t i = 0; i < m_vector_of_tags_tags.size(); ++i )
			c.add_field( m_vector_of_tags_tags.at( i ).cfg() );
	}

	if( m_custom_tags.is_defined() )
	{
		for( std::size_t i = 0; i < m_custom_tags.size(); ++i )
			c.add_field( m_custom_tags.at( i ).cfg() );
	}

	return c;
}